

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O3

void __thiscall
lwlog::
logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
::logger<>(logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
           *this,string_view name)

{
  pointer psVar1;
  element_type *peVar2;
  vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  *__range2;
  shared_ptr<lwlog::interface::sink> *sink;
  pointer psVar3;
  shared_ptr<lwlog::interface::sink> *sink_1;
  undefined1 local_59;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__logger_0011b200;
  (this->m_name)._M_len = name._M_len;
  (this->m_name)._M_str = name._M_str;
  (this->m_backend).sink_storage.
  super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_backend).sink_storage.
  super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_backend).sink_storage.
  super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_topics).super_topic_registry_base._vptr_topic_registry_base =
       (_func_int **)&PTR__topic_registry_0011b1b8;
  (this->m_topics).m_current_topic._M_len = 0;
  (this->m_topics).m_current_topic._M_str = (char *)0x0;
  (this->m_topics).m_separator._M_len = 0;
  (this->m_topics).m_separator._M_str = (char *)0x0;
  (this->m_topics).m_topics.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_topics).m_topics.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_topics).m_topics.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  registry::instance();
  if (registry::instance::s_instance.m_is_registry_automatic == true) {
    registry::instance();
    registry::register_logger(&registry::instance::s_instance,&this->super_logger);
  }
  local_48 = (stdout_sink<lwlog::immediate_flush_policy,_lwlog::single_threaded_policy> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lwlog::sinks::stdout_sink<lwlog::immediate_flush_policy,lwlog::single_threaded_policy>,std::allocator<lwlog::sinks::stdout_sink<lwlog::immediate_flush_policy,lwlog::single_threaded_policy>>>
            (a_Stack_40,
             (stdout_sink<lwlog::immediate_flush_policy,_lwlog::single_threaded_policy> **)&local_48
             ,(allocator<lwlog::sinks::stdout_sink<lwlog::immediate_flush_policy,_lwlog::single_threaded_policy>_>
               *)&local_59);
  local_58 = (undefined4)local_48;
  uStack_54 = local_48._4_4_;
  uStack_50 = a_Stack_40[0]._M_pi._0_4_;
  uStack_4c = a_Stack_40[0]._M_pi._4_4_;
  std::
  vector<std::shared_ptr<lwlog::interface::sink>,std::allocator<std::shared_ptr<lwlog::interface::sink>>>
  ::_M_assign_aux<std::shared_ptr<lwlog::interface::sink>const*>
            ((vector<std::shared_ptr<lwlog::interface::sink>,std::allocator<std::shared_ptr<lwlog::interface::sink>>>
              *)&this->m_backend,&local_58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_4c,uStack_50) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_4c,uStack_50));
  }
  psVar3 = (this->m_backend).sink_storage.
           super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_backend).sink_storage.
           super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    do {
      peVar2 = (psVar3->super___shared_ptr<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*peVar2->_vptr_sink[6])(peVar2,6,"{name}",&this->m_name,4);
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
    psVar1 = (this->m_backend).sink_storage.
             super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar3 = (this->m_backend).sink_storage.
                  super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1)
    {
      peVar2 = (psVar3->super___shared_ptr<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*peVar2->_vptr_sink[6])(peVar2,2,"%n",&this->m_name,4);
    }
  }
  (this->m_topics).m_separator._M_len = 1;
  (this->m_topics).m_separator._M_str = "/";
  return;
}

Assistant:

logger<Config, LogExecutionPolicy, FlushPolicy, ThreadingPolicy, Sinks...>::logger(std::string_view name,
		SinkParams&&... params)
		: m_name{ name }
	{
		LogExecutionPolicy::template init<Config>(m_backend);

		if(registry::instance().is_registry_automatic()) 
			registry::instance().register_logger(this);

		m_backend.sink_storage = { sinks::sink_factory<Sinks<FlushPolicy, ThreadingPolicy>>::request(
			std::forward<SinkParams>(params)...
		)... };

		logger::add_attribute("{name}", m_name);
		logger::add_attribute("%n", m_name);

		logger::set_topic_separator("/");
	}